

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O2

void apriltag_detector_destroy(apriltag_detector_t *td)

{
  timeprofile_t *__ptr;
  
  __ptr = td->tp;
  zarray_destroy(__ptr->stamps);
  free(__ptr);
  workerpool_destroy(td->wp);
  apriltag_detector_clear_families(td);
  zarray_destroy(td->tag_families);
  free(td);
  return;
}

Assistant:

void apriltag_detector_destroy(apriltag_detector_t *td)
{
    timeprofile_destroy(td->tp);
    workerpool_destroy(td->wp);

    apriltag_detector_clear_families(td);

    zarray_destroy(td->tag_families);
    free(td);
}